

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_init_from_data(bson_iter_t *iter,uint8_t *data,size_t length)

{
  _Bool _Var1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar2 = "iter";
    uStack_10 = 0x5d;
  }
  else {
    if (data != (uint8_t *)0x0) {
      if (((length - 0x80000000 < 0xffffffff80000005) || (*(uint *)data != length)) ||
         (data[length - 1] != '\0')) {
        (iter->value).value.v_regex.options = (char *)0x0;
        *(undefined8 *)((long)&(iter->value).value + 0x10) = 0;
        (iter->value).value_type = BSON_TYPE_EOD;
        (iter->value).padding = 0;
        (iter->value).value.v_int64 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->next_off = 0;
        iter->err_off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->raw = (uint8_t *)0x0;
        iter->len = 0;
        iter->off = 0;
        _Var1 = false;
      }
      else {
        iter->raw = data;
        iter->len = (uint32_t)length;
        iter->off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->next_off = 4;
        iter->err_off = 0;
        _Var1 = true;
      }
      return _Var1;
    }
    pcVar2 = "data";
    uStack_10 = 0x5e;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uStack_10,"bson_iter_init_from_data",pcVar2);
  abort();
}

Assistant:

bool
bson_iter_init_from_data (bson_iter_t *iter,   /* OUT */
                          const uint8_t *data, /* IN */
                          size_t length)       /* IN */
{
   uint32_t len_le;

   BSON_ASSERT (iter);
   BSON_ASSERT (data);

   if (BSON_UNLIKELY ((length < 5) || (length > INT_MAX))) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   memcpy (&len_le, data, sizeof (len_le));

   if (BSON_UNLIKELY ((size_t) BSON_UINT32_FROM_LE (len_le) != length)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   if (BSON_UNLIKELY (data[length - 1])) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = (uint8_t *) data;
   iter->len = length;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}